

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

Attribute __thiscall
cali::Caliper::create_attribute
          (Caliper *this,string *name,cali_attr_type type,int prop,int n_meta,Attribute *meta_attr,
          Variant *meta_val)

{
  siglock *psVar1;
  pthread_mutex_t *ppVar2;
  ThreadData *pTVar3;
  ThreadData *this_00;
  pointer pCVar4;
  _Rb_tree_color _Var5;
  iterator iVar6;
  Node *pNVar7;
  iterator iVar8;
  Node *pNVar9;
  Attribute AVar10;
  ulong uVar11;
  Channel *channel;
  pointer pCVar12;
  GlobalData *pGVar13;
  lock_guard<std::mutex> ga;
  bool bVar14;
  Attribute name_attr;
  cali_variant_t local_68;
  Attribute local_48;
  Attribute local_40;
  Attribute prop_attr;
  
  ppVar2 = (pthread_mutex_t *)this->sG;
  if (ppVar2 == (pthread_mutex_t *)0x0) {
    __assert_fail("sG != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/Caliper.cpp"
                  ,0x2a4,
                  "virtual Attribute cali::Caliper::create_attribute(const std::string &, cali_attr_type, int, int, const Attribute *, const Variant *)"
                 );
  }
  pTVar3 = this->sT;
  psVar1 = &pTVar3->lock;
  psVar1->m_lock = psVar1->m_lock + 1;
  std::mutex::lock((mutex *)&ppVar2->__data);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
          ::find(&(this->sG->attribute_map)._M_t,name);
  if ((_Rb_tree_header *)iVar6._M_node ==
      &(this->sG->attribute_map)._M_t._M_impl.super__Rb_tree_header) {
    pthread_mutex_unlock(ppVar2);
    pNVar7 = *(Node **)((long)internal::MetadataTree::mG._M_b._M_p + 0x78 + (ulong)type * 8);
    uVar11 = 0;
    if (0 < n_meta) {
      uVar11 = (ulong)(uint)n_meta;
    }
    while (bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14) {
      pNVar7 = internal::MetadataTree::get_child(&this->sT->tree,meta_attr,meta_val,pNVar7);
      meta_val = meta_val + 1;
      meta_attr = meta_attr + 1;
    }
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->sG->attribute_prop_presets)._M_t,name);
    if ((_Rb_tree_header *)iVar8._M_node !=
        &(this->sG->attribute_prop_presets)._M_t._M_impl.super__Rb_tree_header) {
      prop = iVar8._M_node[2]._M_color;
    }
    _Var5 = prop & 0xfffffbc3 | 0x40c;
    if (((uint)prop >> 9 & 1) == 0) {
      _Var5 = prop;
    }
    if ((_Var5 & 0x3c) == _S_red) {
      _Var5 = _Var5 | this->sG->attribute_default_scope;
    }
    for (pNVar9 = pNVar7; pNVar9 != (Node *)0x0;
        pNVar9 = *(Node **)((long)&(((pNVar9->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                   super_LockfreeIntrusiveTree<cali::Node>).m_me +
                           (pNVar9->super_LockfreeIntrusiveTree<cali::Node>).m_node)) {
      if (pNVar9->m_attribute == cali_class_aggregatable_attr_id) {
        local_68 = (pNVar9->m_data).m_v;
        name_attr.m_node = (Node *)0x7;
        bVar14 = operator==((Variant *)&local_68,(Variant *)&name_attr);
        if (bVar14) {
          _Var5 = _Var5 | 0x800;
          break;
        }
      }
    }
    pNVar9 = internal::MetadataTree::node(&this->sT->tree,8);
    name_attr = Attribute::make_attribute(pNVar9);
    pNVar9 = internal::MetadataTree::node(&this->sT->tree,10);
    prop_attr = Attribute::make_attribute(pNVar9);
    local_68.value =
         (anon_union_8_7_33918203_for_value)(anon_union_8_7_33918203_for_value)(long)(int)_Var5;
    local_68.type_and_size = 2;
    pNVar7 = internal::MetadataTree::get_child
                       (&this->sT->tree,&prop_attr,(Variant *)&local_68,pNVar7);
    this_00 = this->sT;
    local_68 = cali_make_variant(CALI_TYPE_STRING,(name->_M_dataplus)._M_p,name->_M_string_length);
    pNVar7 = internal::MetadataTree::get_child
                       (&this_00->tree,&name_attr,(Variant *)&local_68,pNVar7);
    ppVar2 = (pthread_mutex_t *)this->sG;
    std::mutex::lock((mutex *)&ppVar2->__data);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
            ::lower_bound(&(this->sG->attribute_map)._M_t,name);
    pGVar13 = this->sG;
    if ((_Rb_tree_header *)iVar6._M_node !=
        &(pGVar13->attribute_map)._M_t._M_impl.super__Rb_tree_header) {
      bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (iVar6._M_node + 1),name);
      if (!bVar14) {
        pNVar7 = *(Node **)(iVar6._M_node + 2);
        pthread_mutex_unlock(ppVar2);
        local_40.m_node = pNVar7;
        goto LAB_001fae0d;
      }
      pGVar13 = this->sG;
    }
    AVar10 = Attribute::make_attribute(pNVar7);
    std::__cxx11::string::string((string *)&local_68,(string *)name);
    local_48 = AVar10;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::Attribute>,std::_Select1st<std::pair<std::__cxx11::string_const,cali::Attribute>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
    ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,cali::Attribute>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::Attribute>,std::_Select1st<std::pair<std::__cxx11::string_const,cali::Attribute>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
                *)&pGVar13->attribute_map,(const_iterator)iVar6._M_node,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>
                *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pthread_mutex_unlock(ppVar2);
    local_40 = Attribute::make_attribute(pNVar7);
    pCVar4 = (this->sG->all_channels).
             super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar12 = (this->sG->all_channels).
                   super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                   super__Vector_impl_data._M_start; pCVar12 != pCVar4; pCVar12 = pCVar12 + 1) {
      local_68.type_and_size = (uint64_t)this;
      util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
                (&((pCVar12->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->events,(Caliper **)&local_68,&local_40);
    }
  }
  else {
    pNVar7 = *(Node **)(iVar6._M_node + 2);
    pthread_mutex_unlock(ppVar2);
    local_40.m_node = pNVar7;
  }
LAB_001fae0d:
  psVar1 = &pTVar3->lock;
  psVar1->m_lock = psVar1->m_lock + -1;
  return (Attribute)local_40.m_node;
}

Assistant:

Attribute Caliper::create_attribute(
    const std::string& name,
    cali_attr_type     type,
    int                prop,
    int                n_meta,
    const Attribute*   meta_attr,
    const Variant*     meta_val
)
{
    assert(sG != 0);

    std::lock_guard<::siglock> g(sT->lock);

    // Check if an attribute with this name already exists
    {
        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.find(name);
        if (it != sG->attribute_map.end())
            return it->second;
    }

    Node* node = nullptr;

    // Get type node
    node = sT->tree.type_node(type);

    // Add metadata nodes.
    for (int n = 0; n < n_meta; ++n)
        node = sT->tree.get_child(meta_attr[n], meta_val[n], node);

    // Look for attribute properties in presets
    auto propit = sG->attribute_prop_presets.find(name);
    if (propit != sG->attribute_prop_presets.end())
        prop = propit->second;

    // Set scope to PROCESS for all global attributes and mark them as unaligned
    if (prop & CALI_ATTR_GLOBAL) {
        prop &= ~CALI_ATTR_SCOPE_MASK;
        prop |= CALI_ATTR_SCOPE_PROCESS;
        prop |= CALI_ATTR_UNALIGNED;
    }
    // Set scope to default scope if none is set
    if ((prop & CALI_ATTR_SCOPE_MASK) == 0)
        prop |= sG->attribute_default_scope;

    // Set CALI_ATTR_AGGREGATABLE property if class.aggregatable metadata is set
    for (const Node* tmp = node; tmp; tmp = tmp->parent())
        if (tmp->attribute() == cali_class_aggregatable_attr_id && tmp->data() == Variant(true)) {
            prop |= CALI_ATTR_AGGREGATABLE;
            break;
        }

    Attribute name_attr = Attribute::make_attribute(sT->tree.node(Attribute::NAME_ATTR_ID));
    Attribute prop_attr = Attribute::make_attribute(sT->tree.node(Attribute::PROP_ATTR_ID));

    node = sT->tree.get_child(prop_attr, Variant(prop), node);
    node = sT->tree.get_child(name_attr, Variant(CALI_TYPE_STRING, name.data(), name.size()), node);

    {
        // Check again if attribute already exists; might have been created by
        // another thread in the meantime.
        // We've created some redundant nodes then, but that's fine

        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.lower_bound(name);

        if (it == sG->attribute_map.end() || it->first != name)
            sG->attribute_map.insert(it, std::make_pair(name, Attribute::make_attribute(node)));
        else
            return it->second;
    }

    // Create attribute object

    Attribute attr = Attribute::make_attribute(node);

    for (auto& channel : sG->all_channels)
        channel.mP->events.create_attr_evt(this, attr);

    return attr;
}